

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ssl_client_hello_get_extension
               (SSL_CLIENT_HELLO *client_hello,CBS *out,uint16_t extension_type)

{
  int iVar1;
  uint16_t type;
  CBS extensions;
  CBS extension;
  uint16_t local_4a;
  CBS local_48;
  CBS local_38;
  
  local_48.data = client_hello->extensions;
  local_48.len = client_hello->extensions_len;
  if (local_48.len != 0) {
    do {
      iVar1 = CBS_get_u16(&local_48,&local_4a);
      if (iVar1 == 0) {
        return false;
      }
      iVar1 = CBS_get_u16_length_prefixed(&local_48,&local_38);
      if (iVar1 == 0) {
        return false;
      }
      if (local_4a == extension_type) {
        out->data = local_38.data;
        out->len = local_38.len;
        return true;
      }
    } while (local_48.len != 0);
  }
  return false;
}

Assistant:

bool ssl_client_hello_get_extension(const SSL_CLIENT_HELLO *client_hello,
                                    CBS *out, uint16_t extension_type) {
  CBS extensions;
  CBS_init(&extensions, client_hello->extensions, client_hello->extensions_len);
  while (CBS_len(&extensions) != 0) {
    // Decode the next extension.
    uint16_t type;
    CBS extension;
    if (!CBS_get_u16(&extensions, &type) ||
        !CBS_get_u16_length_prefixed(&extensions, &extension)) {
      return false;
    }

    if (type == extension_type) {
      *out = extension;
      return true;
    }
  }

  return false;
}